

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

bool ImGui::IsRectVisible(ImVec2 *size)

{
  ImGuiWindow *pIVar1;
  bool bVar2;
  ImRect local_10;
  
  pIVar1 = GImGui->CurrentWindow;
  local_10.Min.x = (pIVar1->DC).CursorPos.x;
  local_10.Min.y = (pIVar1->DC).CursorPos.y;
  local_10.Max.x = (*size).x + local_10.Min.x;
  local_10.Max.y = (*size).y + local_10.Min.y;
  bVar2 = ImRect::Overlaps(&pIVar1->ClipRect,&local_10);
  return bVar2;
}

Assistant:

bool ImGui::IsRectVisible(const ImVec2& size)
{
    ImGuiWindow* window = GetCurrentWindowRead();
    return window->ClipRect.Overlaps(ImRect(window->DC.CursorPos, window->DC.CursorPos + size));
}